

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_tattle(REF_GEOM ref_geom,REF_INT node)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  printf(" tattle on node = %d\n");
  uVar7 = 0xffffffff;
  if (-1 < node) {
    uVar7 = 0xffffffff;
    if (node < ref_geom->ref_adj->nnode) {
      uVar7 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar7 != -1) {
    uVar6 = (ulong)(uint)ref_geom->ref_adj->item[(int)uVar7].ref;
    do {
      pRVar2 = ref_geom->descr;
      iVar4 = (int)uVar6;
      uVar5 = iVar4 * 6;
      iVar1 = pRVar2[(int)uVar5];
      if (iVar1 == 2) {
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               ref_geom->param[iVar4 * 2],ref_geom->param[iVar4 * 2 + 1],uVar6,
               (ulong)(uint)pRVar2[(int)(uVar5 | 1)],(ulong)(uint)pRVar2[(long)(int)uVar5 + 3],
               (ulong)(uint)pRVar2[(long)(int)uVar5 + 4],(ulong)(uint)pRVar2[(long)(int)uVar5 + 5]);
      }
      else if (iVar1 == 1) {
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n",ref_geom->param[iVar4 * 2],
               uVar6,(ulong)(uint)pRVar2[(int)(uVar5 | 1)],(ulong)(uint)pRVar2[(long)(int)uVar5 + 3]
               ,(ulong)(uint)pRVar2[(long)(int)uVar5 + 4],(ulong)(uint)pRVar2[(long)(int)uVar5 + 5])
        ;
      }
      else if (iVar1 == 0) {
        printf("%d node: %d id, %d jump, %d degen, %d global\n",uVar6,
               (ulong)(uint)pRVar2[(int)(uVar5 | 1)],(ulong)(uint)pRVar2[(long)(int)uVar5 + 3],
               (ulong)(uint)pRVar2[(long)(int)uVar5 + 4],(ulong)(uint)pRVar2[(long)(int)uVar5 + 5]);
      }
      pRVar3 = ref_geom->ref_adj->item;
      iVar1 = pRVar3[(int)uVar7].next;
      uVar7 = (ulong)iVar1;
      if (uVar7 == 0xffffffffffffffff) {
        uVar6 = 0xffffffff;
      }
      else {
        uVar6 = (ulong)(uint)pRVar3[uVar7].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tattle(REF_GEOM ref_geom, REF_INT node) {
  REF_INT item, geom;

  printf(" tattle on node = %d\n", node);
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    switch (ref_geom_type(ref_geom, geom)) {
      case REF_GEOM_NODE:
        printf("%d node: %d id, %d jump, %d degen, %d global\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom));
        break;
      case REF_GEOM_EDGE:
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom));
        break;
      case REF_GEOM_FACE:
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               geom, ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom),
               ref_geom_param(ref_geom, 1, geom));
        break;
    }
  }

  return REF_SUCCESS;
}